

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fiosav(voccxdef *vctx,char *fname,char *game_fname)

{
  ushort uVar1;
  ushort uVar2;
  mcmcxdef *ctx;
  vocidef **ppvVar3;
  int iVar4;
  uint16_t tmp_2;
  FILE *__s;
  size_t sVar5;
  size_t sVar6;
  uchar *__ptr;
  uint16_t tmp;
  ulong __size;
  mcmon objnum;
  int iVar7;
  uint16_t tmp_1;
  uint uVar8;
  uint16_t tmp_3;
  uint uVar9;
  long lVar10;
  uchar buf [8];
  uint local_68;
  vocidef ***local_60;
  fiosav_cb_ctx fnctx;
  
  ctx = vctx->voccxmem;
  __s = fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    return 1;
  }
  if (game_fname != (char *)0x0) {
    sVar5 = strlen(game_fname);
    buf[0] = (char)(short)sVar5;
    buf[1] = (char)((ushort)(short)sVar5 >> 8);
    sVar6 = fwrite("TADS2 save/g\n\r\x1a",0x10,1,__s);
    if (((sVar6 != 1) || (sVar6 = fwrite(buf,2,1,__s), sVar6 != 1)) ||
       (sVar5 = fwrite(game_fname,(long)(int)sVar5,1,__s), sVar5 != 1)) goto LAB_002151b0;
  }
  sVar5 = fwrite("TADS2 save\n\r\x1a",0xe,1,__s);
  if (((sVar5 == 1) && (sVar5 = fwrite("v2.2.1",7,1,__s), sVar5 == 1)) &&
     (sVar5 = fwrite(vctx->voccxtim,0x1a,1,__s), sVar5 == 1)) {
    local_60 = vctx->voccxinh;
    local_68 = 0;
    for (iVar7 = 0; iVar7 != 0x80; iVar7 = iVar7 + 1) {
      ppvVar3 = *local_60;
      if (ppvVar3 != (vocidef **)0x0) {
        uVar8 = local_68;
        for (lVar10 = 0; (int)lVar10 != 0x800; lVar10 = lVar10 + 8) {
          if ((*(long *)((long)ppvVar3 + lVar10) != 0) &&
             ((*(byte *)((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar8 >> 8][uVar8 & 0xff] >> 8]
                                ->mcmoflg +
                        (ulong)((ctx->mcmcxmtb[uVar8 >> 8][uVar8 & 0xff] & 0xff) << 5)) & 3) != 0))
          {
            objnum = (mcmon)uVar8;
            __ptr = mcmlck(ctx,objnum);
            iVar4 = (uint)*(ushort *)(__ptr + 6) * 4;
            if ((__ptr[2] & 2) == 0) {
              iVar4 = 0;
            }
            uVar1 = *(ushort *)(__ptr + 8);
            __size = (ulong)uVar1;
            if ((*(byte *)(*(long *)((long)ppvVar3 + lVar10) + 8) & 0x10) == 0) {
              uVar2 = *(ushort *)(__ptr + 0xc);
              uVar9 = iVar4 + ((uint)uVar1 - (uint)uVar2);
              if (uVar9 == 0) {
LAB_00215150:
                mcmunlck(ctx,objnum);
                goto LAB_0021516a;
              }
              buf._0_3_ = (uint3)objnum << 8;
              buf[5] = (uchar)uVar9;
              buf[6] = (uchar)(uVar9 >> 8);
              buf._3_2_ = *(ushort *)(__ptr + 6);
              sVar5 = fwrite(buf,7,1,__s);
              if (sVar5 == 1) {
                __ptr = __ptr + uVar2;
                __size = (ulong)uVar9;
                goto LAB_0021513d;
              }
            }
            else {
              buf[1] = (char)objnum;
              buf[2] = (char)(objnum >> 8);
              buf[0] = '\x01';
              buf._3_2_ = uVar1;
              sVar5 = fwrite(buf,7,1,__s);
              if (sVar5 == 1) {
LAB_0021513d:
                sVar5 = fwrite(__ptr,__size,1,__s);
                if (sVar5 == 1) goto LAB_00215150;
              }
            }
            mcmunlck(ctx,objnum);
            goto LAB_002151b0;
          }
LAB_0021516a:
          uVar8 = uVar8 + 1;
        }
      }
      local_60 = local_60 + 1;
      local_68 = local_68 + 0x100;
    }
    buf[0] = '\0';
    buf[1] = 0xff;
    buf[2] = 0xff;
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    sVar5 = fwrite(buf,7,1,__s);
    if ((((sVar5 == 1) &&
         (iVar7 = fiowfda((osfildef *)__s,vctx->voccxdmn,vctx->voccxdmc), iVar7 == 0)) &&
        (iVar7 = fiowfda((osfildef *)__s,vctx->voccxfus,vctx->voccxfuc), iVar7 == 0)) &&
       (iVar7 = fiowfda((osfildef *)__s,vctx->voccxalm,vctx->voccxalc), iVar7 == 0)) {
      fnctx.err = 0;
      fnctx.fp = (osfildef *)__s;
      voc_iterate(vctx,0xffff,fiosav_voc_cb,&fnctx);
      if (fnctx.err == 0) {
        buf[6] = 0xff;
        buf[7] = 0xff;
        sVar5 = fwrite(buf,8,1,__s);
        if (sVar5 == 1) {
          buf._0_2_ = vctx->voccxme;
          sVar5 = fwrite(buf,2,1,__s);
          if (sVar5 == 1) {
            fclose(__s);
            os_settype(fname,1);
            return 0;
          }
        }
      }
    }
  }
LAB_002151b0:
  fclose(__s);
  return 1;
}

Assistant:

int fiosav(voccxdef *vctx, char *fname, char *game_fname)
{
    osfildef   *fp;
    vocidef  ***vpg;
    vocidef   **v;
    int         i;
    int         j;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[8];
    int         err = FALSE;
    struct fiosav_cb_ctx  fnctx;

    /* open the output file */
    if ((fp = osfopwb(fname, OSFTSAVE)) == 0)
        return TRUE;

    /*
     *   If we have game file information, save the game file information
     *   with the saved game file.  This lets the player start the
     *   run-time and restore the game by specifying only the saved game
     *   file.  
     */
    if (game_fname != 0)
    {
        size_t len;
        
        /* write the prefix header */
        len = strlen(game_fname);
        oswp2(buf, len);
        if (osfwb(fp, FIOSAVHDR_PREFIX, (int)sizeof(FIOSAVHDR_PREFIX))
            || osfwb(fp, buf, 2)
            || osfwb(fp, game_fname, (int)len))
            goto ret_error;
    }
    
    /* write save game header and timestamp */
    if (osfwb(fp, FIOSAVHDR, (int)sizeof(FIOSAVHDR))
        || osfwb(fp, FIOSAVVSN, (int)sizeof(FIOSAVVSN))
        || osfwb(fp, vctx->voccxtim, 26))
        goto ret_error;

    /* go through each object, and write if it's been changed */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v != 0)
            {
                /* write object if it's dirty */
                if (mcmobjdirty(mctx, (mcmon)obj))
                {
                    p = mcmlck(mctx, (mcmon)obj);
                    mut = p + objrst(p);
                    propcnt = objnprop(p);
                    mutsiz = objfree(p) - objrst(p);
                    if ((objflg(p) & OBJFINDEX) != 0)
                        mutsiz += propcnt * 4;

                    /*
                     *   If the object was dynamically allocated, write
                     *   the whole object.  Otherwise, write just the
                     *   mutable part. 
                     */
                    if ((*v)->vociflg & VOCIFNEW)
                    {
                        /* indicate that the object is dynamic */
                        buf[0] = 1;
                        oswp2(buf + 1, obj);

                        /* write the entire object */
                        mutsiz = objfree(p);
                        oswp2(buf + 3, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, p, mutsiz))
                            err = TRUE;

#ifdef NEVER
                        {
                            int         wrdcnt;
                            
                            /* count the words, and write the count */
                            voc_count(vctx, obj, 0, &wrdcnt, (int *)0);
                            oswp2(buf, wrdcnt);
                            if (osfwb(fp, buf, 2))
                                err = TRUE;
                            
                            /* write the words */
                            fnctx.err = 0;
                            fnctx.fp = fp;
                            voc_iterate(vctx, obj, fiosav_cb, &fnctx);
                            if (fnctx.err != 0)
                                err = TRUE;
                        }
#endif
                    }
                    else if (mutsiz)
                    {
                        /* write number of properties, size of mut, and mut */
                        buf[0] = 0;   /* indicate that the object is static */
                        oswp2(buf + 1, obj);
                        oswp2(buf + 3, propcnt);
                        oswp2(buf + 5, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, mut, mutsiz))
                            err = TRUE;
                    }
                    
                    mcmunlck(mctx, (mcmon)obj);
                    if (err != 0)
                        goto ret_error;
                }
            }
        }
    }

    /* write end-of-objects indication */
    buf[0] = 0;
    oswp2(buf + 1, MCMONINV);
    oswp4(buf + 3, 0);
    if (osfwb(fp, buf, 7))
        goto ret_error;

    /* write fuses/daemons/alarms */
    if (fiowfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiowfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiowfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* write run-time vocabulary additions and deletions */
    fnctx.fp = fp;
    fnctx.err = 0;
    voc_iterate(vctx, MCMONINV, fiosav_voc_cb, &fnctx);
    if (fnctx.err)
        goto ret_error;

    /* write end marker for vocabulary additions and deletions */
    oswp2(buf+6, MCMONINV);
    if (osfwb(fp, buf, 8))
        goto ret_error;

    /* write the current "Me" object */
    oswp2(buf, vctx->voccxme);
    if (osfwb(fp, buf, 2))
        goto ret_error;

    /* done - close file and return success indication */
    osfcls(fp);
    os_settype(fname, OSFTSAVE);
    return FALSE;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return TRUE;
}